

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_candidate_index_impl.h
# Opt level: O0

void __thiscall
histo_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *label_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *degree_histogram_collection,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *leaf_distance_histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  reference ppVar6;
  reference this_01;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_02;
  reference piVar7;
  pointer ppVar8;
  reference pvVar9;
  mapped_type *pmVar10;
  int *piVar11;
  const_iterator local_1a8;
  reference local_1a0;
  pair<const_int,_int> *element_2;
  iterator __end2_3;
  iterator __begin2_3;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *__range2_3;
  const_iterator local_178;
  reference local_170;
  pair<const_int,_int> *element_1;
  iterator __end2_2;
  iterator __begin2_2;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *__range2_2;
  iterator iStack_148;
  int intersection_1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_140;
  iterator cand;
  iterator iStack_130;
  int pre_cand_id;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  reference ppStack_110;
  int intersection;
  pair<int,_int> *il_entry;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  pair<const_int,_int> *element;
  iterator __end2;
  iterator __begin2;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *__range2;
  undefined1 local_c8 [4];
  int i;
  vector<int,_std::allocator<int>_> pre_candidates;
  pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  *histogram;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *__range1;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> intersection_cnt;
  int current_tree_id;
  allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_59;
  undefined1 local_58 [8];
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  double distance_threshold_local;
  int il_size_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates_local;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *leaf_distance_histogram_collection_local;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *degree_histogram_collection_local;
  vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
  *label_histogram_collection_local;
  CandidateIndex *this_local;
  
  il_index.
  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)distance_threshold;
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  allocator(&local_59);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            *)local_58,(long)(il_size + 1),&local_59);
  std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~allocator(&local_59);
  intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  sVar4 = std::
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          ::size(label_histogram_collection);
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,sVar4,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           ::begin(label_histogram_collection);
  histogram = (pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
               *)std::
                 vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 ::end(label_histogram_collection);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
                                     *)&histogram), bVar3) {
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         &__gnu_cxx::
          __normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
          ::operator*(&__end1)->first;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_c8);
    if ((double)*pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage <=
        (double)il_index.
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      for (__range2._4_4_ = 0;
          __range2._4_4_ <
          (int)intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage; __range2._4_4_ = __range2._4_4_ + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_c8,
                   (value_type_conflict2 *)((long)&__range2 + 4));
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_88,(long)__range2._4_4_);
        *pvVar5 = *pvVar5 + 1;
      }
    }
    this_00 = (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)(pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 2);
    __end2 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::begin(this_00);
    element = (pair<const_int,_int> *)
              std::
              unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::end(this_00);
    while (bVar3 = std::__detail::operator!=
                             (&__end2.super__Node_iterator_base<std::pair<const_int,_int>,_false>,
                              (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&element),
          bVar3) {
      ppVar6 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                         (&__end2);
      this_01 = std::
                vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)local_58,(long)ppVar6->first);
      __end3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (this_01);
      il_entry = (pair<int,_int> *)
                 std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                           (this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                         *)&il_entry), bVar3) {
        ppStack_110 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ::operator*(&__end3);
        piVar11 = std::min<int>(&ppVar6->second,&ppStack_110->second);
        __range2_1._4_4_ = *piVar11;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_88,(long)ppStack_110->first);
        if ((*pvVar5 == 0) && (__range2_1._4_4_ != 0)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_c8,&ppStack_110->first);
        }
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_88,(long)ppStack_110->first);
        __range2_1._0_4_ = *pvVar5 + __range2_1._4_4_;
        piVar11 = std::min<int>((int *)&__range2_1,
                                pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage);
        iVar2 = *piVar11;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_88,(long)ppStack_110->first);
        *pvVar5 = iVar2;
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&__end3);
      }
      this_02 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                std::
                vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ::operator[]((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                              *)local_58,(long)ppVar6->first);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                (this_02,(int *)&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar6->second);
      std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator++(&__end2);
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_c8);
    this->pre_candidates_ = sVar4 + this->pre_candidates_;
    __end2_1 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_c8);
    iStack_130 = std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_c8);
    while (bVar3 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffed0), bVar3) {
      piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2_1);
      cand._M_current._4_4_ = *piVar7;
      pvVar9 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](label_histogram_collection,
                            (long)(int)intersection_cnt.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage);
      iVar2 = pvVar9->first;
      pvVar9 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](label_histogram_collection,(long)cand._M_current._4_4_);
      iVar1 = pvVar9->first;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,(long)cand._M_current._4_4_)
      ;
      if ((double)((iVar2 + iVar1 + *pvVar5 * -2) / 2) <=
          (double)il_index.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   (int *)&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                   (int *)((long)&cand._M_current + 4));
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,(long)cand._M_current._4_4_)
      ;
      *pvVar5 = 0;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2_1);
    }
    intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c8);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_*,_std::vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  local_140._M_current =
       (pair<int,_int> *)
       std::begin<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                 (join_candidates);
  do {
    iStack_148 = std::end<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                           (join_candidates);
    bVar3 = __gnu_cxx::operator!=(&local_140,&stack0xfffffffffffffeb8);
    if (!bVar3) {
LAB_001080fd:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88)
      ;
      std::
      vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      ::~vector((vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)local_58);
      return;
    }
    __range2_2._4_4_ = 0;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](degree_histogram_collection,(long)ppVar8->first);
    __end2_2 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::begin(&pvVar9->second);
    element_1 = (pair<const_int,_int> *)
                std::
                unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::end(&pvVar9->second);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_2.super__Node_iterator_base<std::pair<const_int,_int>,_false>,
                              (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&element_1),
          bVar3) {
      local_170 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                            (&__end2_2);
      piVar11 = &local_170->second;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_140);
      pvVar9 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](degree_histogram_collection,(long)ppVar8->second);
      pmVar10 = std::
                unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::operator[](&pvVar9->second,&local_170->first);
      piVar11 = std::min<int>(piVar11,pmVar10);
      __range2_2._4_4_ = *piVar11 + __range2_2._4_4_;
      std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator++(&__end2_2);
    }
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](degree_histogram_collection,(long)ppVar8->first);
    iVar2 = pvVar9->first;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](degree_histogram_collection,(long)ppVar8->second);
    if ((double)il_index.
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage <
        (double)((iVar2 + pvVar9->first + __range2_2._4_4_ * -2) / 5)) {
      __gnu_cxx::
      __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
      ::__normal_iterator<std::pair<int,int>*>
                ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                  *)&local_178,&local_140);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
                (join_candidates,local_178);
      goto LAB_001080fd;
    }
    __range2_2._4_4_ = 0;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](leaf_distance_histogram_collection,(long)ppVar8->first);
    __end2_3 = std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::begin(&pvVar9->second);
    element_2 = (pair<const_int,_int> *)
                std::
                unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::end(&pvVar9->second);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_3.super__Node_iterator_base<std::pair<const_int,_int>,_false>,
                              (_Node_iterator_base<std::pair<const_int,_int>,_false> *)&element_2),
          bVar3) {
      local_1a0 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator*
                            (&__end2_3);
      piVar11 = &local_1a0->second;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_140);
      pvVar9 = std::
               vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               ::operator[](leaf_distance_histogram_collection,(long)ppVar8->second);
      pmVar10 = std::
                unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::operator[](&pvVar9->second,&local_1a0->first);
      piVar11 = std::min<int>(piVar11,pmVar10);
      __range2_2._4_4_ = *piVar11 + __range2_2._4_4_;
      std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator++(&__end2_3);
    }
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](degree_histogram_collection,(long)ppVar8->first);
    iVar2 = pvVar9->first;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_140);
    pvVar9 = std::
             vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
             ::operator[](degree_histogram_collection,(long)ppVar8->second);
    if ((double)il_index.
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage <
        (double)(iVar2 + pvVar9->first + __range2_2._4_4_ * -2)) {
      __gnu_cxx::
      __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
      ::__normal_iterator<std::pair<int,int>*>
                ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                  *)&local_1a8,&local_140);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
                (join_candidates,local_1a8);
      goto LAB_001080fd;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_140,0);
  } while( true );
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& label_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& degree_histogram_collection,
    std::vector<std::pair<int, std::unordered_map<int, int>>>& leaf_distance_histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(label_histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: label_histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    // get precandidates from the inverted list by looking up all elements
    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((label_histogram_collection[current_tree_id].first + label_histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }

  // apply degree and leaf distance lower bound for all candidates
  auto cand = std::begin(join_candidates);
  while(cand != std::end(join_candidates)) {
    // count degree intersection
    int intersection = 0;
    for(auto& element: degree_histogram_collection[cand->first].second)
      intersection += std::min(element.second, degree_histogram_collection[cand->second].second[element.first]);
    // remove pair if degree lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) / 5 > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    // count leaf distance intersection
    intersection = 0;
    for(auto& element: leaf_distance_histogram_collection[cand->first].second)
      intersection += std::min(element.second, leaf_distance_histogram_collection[cand->second].second[element.first]);
    // remove pair if leaf distance lower bound is not satisfied
    if((degree_histogram_collection[cand->first].first + degree_histogram_collection[cand->second].first - 
        (2 * intersection)) > distance_threshold) {
      join_candidates.erase(cand);
      break;
    }
    cand++;
  }
}